

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaFacetErr(xmlSchemaAbstractCtxtPtr actxt,xmlParserErrors error,xmlNodePtr node,
                      xmlChar *value,unsigned_long length,xmlSchemaTypePtr type,
                      xmlSchemaFacetPtr facet,char *message,xmlChar *str1,xmlChar *str2)

{
  xmlSchemaWhitespaceValueType ws;
  int iVar1;
  xmlElementType *pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  unsigned_long uVar5;
  xmlSchemaTypeType type_00;
  char *pcVar6;
  xmlChar *str2_00;
  xmlChar *msg;
  xmlChar *cur;
  xmlParserErrors xVar7;
  xmlSchemaFacetPtr pxVar8;
  bool bVar9;
  char len [25];
  char actLen [25];
  xmlChar **str1_00;
  xmlChar **ppxVar10;
  xmlChar **str2_01;
  xmlChar *local_a8;
  xmlParserErrors local_9c;
  xmlNodePtr local_98;
  xmlSchemaAbstractCtxtPtr local_90;
  xmlChar **local_88;
  xmlChar *local_80;
  xmlChar *local_78 [4];
  xmlChar *local_58 [5];
  
  local_a8 = (xmlChar *)0x0;
  if (node == (xmlNodePtr)0x0) {
    if ((actxt->type == 2) &&
       (pxVar2 = *(xmlElementType **)(actxt + 0xc), pxVar2 != (xmlElementType *)0x0))
    goto LAB_001ca821;
    bVar9 = false;
  }
  else {
    pxVar2 = &node->type;
LAB_001ca821:
    bVar9 = *pxVar2 == XML_ATTRIBUTE_NODE;
  }
  str2_00 = (xmlChar *)length;
  local_98 = node;
  local_90 = actxt;
  local_88 = (xmlChar **)value;
  xmlSchemaFormatNodeForError(&local_a8,actxt,node);
  type_00 = XML_SCHEMA_FACET_ENUMERATION;
  if (error != XML_SCHEMAV_CVC_ENUMERATION_VALID) {
    type_00 = facet->type;
  }
  local_9c = error;
  local_a8 = xmlStrcat(local_a8,"[");
  pxVar3 = xmlStrcat(local_a8,(xmlChar *)"facet \'");
  local_a8 = pxVar3;
  pxVar4 = xmlSchemaFacetTypeToString(type_00);
  local_a8 = xmlStrcat(pxVar3,pxVar4);
  local_a8 = xmlStrcat(local_a8,(xmlChar *)"\'] ");
  xVar7 = local_9c;
  if (type_00 - XML_SCHEMA_FACET_LENGTH < 3) {
    pcVar6 = "The value has a length of \'%s\'; ";
    if (bVar9) {
      pcVar6 = "The value \'%s\' has a length of \'%s\'; ";
    }
    local_a8 = xmlStrcat(local_a8,(xmlChar *)pcVar6);
    uVar5 = xmlSchemaGetFacetValueAsULong(facet);
    ppxVar10 = local_78;
    snprintf((char *)ppxVar10,0x18,"%lu",uVar5);
    str2_01 = local_58;
    snprintf((char *)str2_01,0x18,"%lu",length);
    xVar7 = local_9c;
    if (type_00 == XML_SCHEMA_FACET_MINLENGTH) {
      local_a8 = xmlStrcat(local_a8,(xmlChar *)
                                    "this underruns the allowed minimum length of \'%s\'.\n");
      xVar7 = local_9c;
    }
    else {
      if (type_00 == XML_SCHEMA_FACET_MAXLENGTH) {
        pcVar6 = "this exceeds the allowed maximum length of \'%s\'.\n";
      }
      else {
        if (type_00 != XML_SCHEMA_FACET_LENGTH) goto LAB_001ca9c7;
        pcVar6 = "this differs from the allowed length of \'%s\'.\n";
      }
      local_a8 = xmlStrcat(local_a8,(xmlChar *)pcVar6);
    }
LAB_001ca9c7:
    str1_00 = local_88;
    if (!bVar9) {
      str1_00 = str2_01;
      str2_01 = ppxVar10;
      ppxVar10 = (xmlChar **)0x0;
    }
    xmlSchemaErr4Line(local_90,XML_ERR_ERROR,xVar7,local_98,0,(char *)local_a8,(xmlChar *)str1_00,
                      (xmlChar *)str2_01,(xmlChar *)ppxVar10,(xmlChar *)0x0);
    pxVar3 = (xmlChar *)0x0;
    goto LAB_001cabad;
  }
  switch(type_00) {
  case XML_SCHEMA_FACET_MININCLUSIVE:
    pcVar6 = "The value \'%s\' is less than the minimum value allowed (\'%s\').\n";
    break;
  case XML_SCHEMA_FACET_MINEXCLUSIVE:
    pcVar6 = "The value \'%s\' must be greater than \'%s\'.\n";
    break;
  case XML_SCHEMA_FACET_MAXINCLUSIVE:
    pcVar6 = "The value \'%s\' is greater than the maximum value allowed (\'%s\').\n";
    break;
  case XML_SCHEMA_FACET_MAXEXCLUSIVE:
    pcVar6 = "The value \'%s\' must be less than \'%s\'.\n";
    break;
  case XML_SCHEMA_FACET_TOTALDIGITS:
    pcVar6 = "The value \'%s\' has more digits than are allowed (\'%s\').\n";
    break;
  case XML_SCHEMA_FACET_FRACTIONDIGITS:
    pcVar6 = "The value \'%s\' has more fractional digits than are allowed (\'%s\').\n";
    break;
  case XML_SCHEMA_FACET_PATTERN:
    pcVar6 = "The value \'%s\' is not accepted by the pattern \'%s\'.\n";
    break;
  case XML_SCHEMA_FACET_ENUMERATION:
    local_a8 = xmlStrcat(local_a8,(xmlChar *)"The value \'%s\' is not an element of the set {%s}.\n"
                        );
    local_78[0] = (xmlChar *)0x0;
    pxVar3 = (xmlChar *)0x0;
    local_80 = local_a8;
    do {
      ws = xmlSchemaGetWhiteSpaceFacetValue(type->baseType);
      pxVar8 = type->facets;
      if (pxVar8 != (xmlSchemaFacetPtr)0x0) {
        bVar9 = false;
        cur = pxVar3;
        do {
          pxVar3 = cur;
          if (pxVar8->type == XML_SCHEMA_FACET_ENUMERATION) {
            iVar1 = xmlSchemaGetCanonValueWhtspExt_1(pxVar8->val,ws,local_78,0);
            if (iVar1 == -1) {
              pxVar3 = (xmlChar *)0x0;
              xmlSchemaInternalErr2
                        (local_90,"xmlSchemaFormatFacetEnumSet",
                         "compute the canonical lexical representation",(xmlChar *)0x0,str2_00);
              xVar7 = local_9c;
              msg = local_80;
              ppxVar10 = local_88;
              pxVar4 = pxVar3;
              if (cur != (xmlChar *)0x0) {
                (*xmlFree)(cur);
                pxVar3 = (xmlChar *)0x0;
                msg = local_80;
                ppxVar10 = local_88;
                pxVar4 = pxVar3;
              }
              goto LAB_001caba8;
            }
            if (cur == (xmlChar *)0x0) {
              pxVar3 = xmlStrdup("\'");
            }
            else {
              pxVar3 = xmlStrcat(cur,(xmlChar *)", \'");
            }
            pxVar3 = xmlStrcat(pxVar3,local_78[0]);
            pxVar3 = xmlStrcat(pxVar3,"\'");
            bVar9 = true;
            if (local_78[0] != (xmlChar *)0x0) {
              (*xmlFree)(local_78[0]);
              local_78[0] = (xmlChar *)0x0;
            }
          }
          pxVar8 = pxVar8->next;
          cur = pxVar3;
        } while (pxVar8 != (_xmlSchemaFacet *)0x0);
        msg = local_80;
        xVar7 = local_9c;
        ppxVar10 = local_88;
        pxVar4 = pxVar3;
        if (bVar9) goto LAB_001caba8;
      }
      type = type->baseType;
      msg = local_80;
      xVar7 = local_9c;
      ppxVar10 = local_88;
      pxVar4 = pxVar3;
      if ((type == (xmlSchemaTypePtr)0x0) || (type->type == XML_SCHEMA_TYPE_BASIC))
      goto LAB_001caba8;
    } while( true );
  default:
    if (bVar9) {
      local_a8 = xmlStrcat(local_a8,(xmlChar *)"The value \'%s\' is not facet-valid.\n");
      pxVar4 = (xmlChar *)0x0;
      ppxVar10 = local_88;
    }
    else {
      local_a8 = xmlStrcat(local_a8,(xmlChar *)"The value is not facet-valid.\n");
      pxVar4 = (xmlChar *)0x0;
      ppxVar10 = (xmlChar **)0x0;
    }
    goto LAB_001cab8f;
  }
  local_a8 = xmlStrcat(local_a8,(xmlChar *)pcVar6);
  pxVar4 = facet->value;
  ppxVar10 = local_88;
LAB_001cab8f:
  pxVar3 = (xmlChar *)0x0;
  msg = local_a8;
LAB_001caba8:
  xmlSchemaErr4Line(local_90,XML_ERR_ERROR,xVar7,local_98,0,(char *)msg,(xmlChar *)ppxVar10,pxVar4,
                    (xmlChar *)0x0,(xmlChar *)0x0);
LAB_001cabad:
  if (pxVar3 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar3);
  }
  (*xmlFree)(local_a8);
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(8,0)
xmlSchemaFacetErr(xmlSchemaAbstractCtxtPtr actxt,
		  xmlParserErrors error,
		  xmlNodePtr node,
		  const xmlChar *value,
		  unsigned long length,
		  xmlSchemaTypePtr type,
		  xmlSchemaFacetPtr facet,
		  const char *message,
		  const xmlChar *str1,
		  const xmlChar *str2)
{
    xmlChar *str = NULL, *msg = NULL;
    xmlSchemaTypeType facetType;
    int nodeType = xmlSchemaEvalErrorNodeType(actxt, node);

    xmlSchemaFormatNodeForError(&msg, actxt, node);
    if (error == XML_SCHEMAV_CVC_ENUMERATION_VALID) {
	facetType = XML_SCHEMA_FACET_ENUMERATION;
	/*
	* If enumerations are validated, one must not expect the
	* facet to be given.
	*/
    }